

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::LogToSinks
               (LogSeverity severity,char *full_filename,char *base_filename,int line,
               LogMessageTime *logmsgtime,char *message,size_t message_len)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  shared_lock<std::shared_mutex> l;
  
  l._M_pm = (mutex_type *)sink_mutex_;
  l._M_owns = true;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)sink_mutex_);
  if (sinks_ != (long *)0x0) {
    lVar2 = sinks_[1] - *sinks_ >> 3;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      plVar1 = *(long **)(*sinks_ + lVar2 * 8);
      (**(code **)(*plVar1 + 0x10))
                (plVar1,severity,full_filename,base_filename,line,logmsgtime,message,message_len);
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&l);
  return;
}

Assistant:

inline void LogDestination::LogToSinks(LogSeverity severity,
                                       const char* full_filename,
                                       const char* base_filename, int line,
                                       const LogMessageTime& logmsgtime,
                                       const char* message,
                                       size_t message_len) {
  std::shared_lock<SinkMutex> l{sink_mutex_};
  if (sinks_) {
    for (size_t i = sinks_->size(); i-- > 0;) {
      (*sinks_)[i]->send(severity, full_filename, base_filename, line,
                         logmsgtime, message, message_len);
    }
  }
}